

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_substring_rangeBeyondBounds_fn(int _i)

{
  int iVar1;
  AString *pAVar2;
  char *pcVar3;
  char *expr;
  char **ppcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_90;
  char *pcStack_88;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  undefined8 uStack_60;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.buffer = (char *)0x0;
  string.size = 0x10;
  string.capacity = 0x10;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_60 = 0x14dc6e;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,0x11);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"abcd01234567wxyz",0x11);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_60 = 0x14dcab;
  pAVar2 = AString_substring(&string,0,0x11);
  if (pAVar2 == (AString *)0x0) {
    pcVar7 = "(void*) substring != NULL";
    pcVar6 = "(void*) substring";
    iVar1 = 0x9a1;
LAB_0014ea49:
    uStack_60 = 0;
    local_68 = (char *)0x0;
    pcStack_70 = (char *)0x14ea50;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar1,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x",pcVar7,pcVar6);
  }
  uStack_60 = 0x14dcc8;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9a1);
  pcVar7 = (char *)pAVar2->capacity;
  if (pcVar7 != (char *)0x10) {
    pcStack_70 = "(16)";
    pcVar5 = "(*substring).capacity == (16)";
    pcVar6 = "(*substring).capacity";
LAB_0014e354:
    iVar1 = 0x9a2;
LAB_0014eadd:
    local_68 = (char *)0x10;
LAB_0014eae3:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar4 = &pcStack_70;
    goto LAB_0014eae5;
  }
  uStack_60 = 0x14dce7;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9a2);
  if (pAVar2->buffer == (char *)0x0) {
    pcVar7 = "(void*) (*substring).buffer != NULL";
    pcVar6 = "(void*) (*substring).buffer";
    iVar1 = 0x9a2;
    goto LAB_0014ea49;
  }
  uStack_60 = 0x14dd03;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9a2);
  pcVar8 = pAVar2->buffer;
  if (pcVar8 == (char *)0x0) {
    pcVar7 = "";
    pcVar8 = "(null)";
  }
  else {
    uStack_60 = 0x14dd22;
    iVar1 = strcmp("abcd01234567wxyz",pcVar8);
    if (iVar1 == 0) {
      uStack_60 = 0x14dd3b;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9a2);
      pcVar7 = (char *)pAVar2->size;
      if (pcVar7 != (char *)0x10) {
        pcStack_70 = "strlen(\"abcd01234567wxyz\")";
        pcVar5 = "(*substring).size == strlen(\"abcd01234567wxyz\")";
        pcVar6 = "(*substring).size";
        goto LAB_0014e354;
      }
      uStack_60 = 0x14dd5a;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9a2);
      if (string.capacity != 0x10) {
        pcStack_70 = "(16)";
        pcVar5 = "(string).capacity == (16)";
        pcVar6 = "(string).capacity";
        pcVar7 = (char *)string.capacity;
LAB_0014e441:
        iVar1 = 0x9a3;
        goto LAB_0014eadd;
      }
      uStack_60 = 0x14dd7a;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9a3);
      if (string.buffer == (char *)0x0) {
        pcVar7 = "(void*) (string).buffer != NULL";
        pcVar6 = "(void*) (string).buffer";
        iVar1 = 0x9a3;
        goto LAB_0014ea49;
      }
      uStack_60 = 0x14dd97;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9a3);
      pcVar8 = string.buffer;
      if (string.buffer == (char *)0x0) {
        pcVar7 = "";
        pcVar8 = "(null)";
LAB_0014e3dc:
        iVar1 = 0x9a3;
LAB_0014e624:
        pcVar6 = "(string).buffer";
        pcVar5 = "(string).buffer == (\"abcd01234567wxyz\")";
      }
      else {
        uStack_60 = 0x14ddb7;
        iVar1 = strcmp("abcd01234567wxyz",string.buffer);
        if (iVar1 != 0) {
          pcVar7 = "\"";
          goto LAB_0014e3dc;
        }
        uStack_60 = 0x14ddd0;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x9a3);
        if (string.size != 0x10) {
          pcStack_70 = "strlen(\"abcd01234567wxyz\")";
          pcVar5 = "(string).size == strlen(\"abcd01234567wxyz\")";
          pcVar6 = "(string).size";
          pcVar7 = (char *)string.size;
          goto LAB_0014e441;
        }
        uStack_60 = 0x14ddf0;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x9a3);
        uStack_60 = 0x14ddf8;
        AString_destruct(pAVar2);
        uStack_60 = 0x14de09;
        pAVar2 = AString_substring(&string,0,0xffffffffffffffff);
        if (pAVar2 == (AString *)0x0) {
          pcVar7 = "(void*) substring != NULL";
          pcVar6 = "(void*) substring";
          iVar1 = 0x9a6;
          goto LAB_0014ea49;
        }
        uStack_60 = 0x14de26;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x9a6);
        pcVar7 = (char *)pAVar2->capacity;
        if (pcVar7 != (char *)0x10) {
          pcStack_70 = "(16)";
          pcVar5 = "(*substring).capacity == (16)";
          pcVar6 = "(*substring).capacity";
LAB_0014e566:
          iVar1 = 0x9a7;
          goto LAB_0014eadd;
        }
        uStack_60 = 0x14de45;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x9a7);
        if (pAVar2->buffer == (char *)0x0) {
          pcVar7 = "(void*) (*substring).buffer != NULL";
          pcVar6 = "(void*) (*substring).buffer";
          iVar1 = 0x9a7;
          goto LAB_0014ea49;
        }
        uStack_60 = 0x14de61;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x9a7);
        pcVar8 = pAVar2->buffer;
        if (pcVar8 != (char *)0x0) {
          uStack_60 = 0x14de80;
          iVar1 = strcmp("abcd01234567wxyz",pcVar8);
          if (iVar1 != 0) {
            pcVar7 = "\"";
            goto LAB_0014e501;
          }
          uStack_60 = 0x14de99;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9a7);
          pcVar7 = (char *)pAVar2->size;
          if (pcVar7 != (char *)0x10) {
            pcStack_70 = "strlen(\"abcd01234567wxyz\")";
            pcVar5 = "(*substring).size == strlen(\"abcd01234567wxyz\")";
            pcVar6 = "(*substring).size";
            goto LAB_0014e566;
          }
          uStack_60 = 0x14deb8;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9a7);
          if (string.capacity != 0x10) {
            pcStack_70 = "(16)";
            pcVar5 = "(string).capacity == (16)";
            pcVar6 = "(string).capacity";
            pcVar7 = (char *)string.capacity;
LAB_0014e65e:
            iVar1 = 0x9a8;
            goto LAB_0014eadd;
          }
          uStack_60 = 0x14ded8;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9a8);
          if (string.buffer == (char *)0x0) {
            pcVar7 = "(void*) (string).buffer != NULL";
            pcVar6 = "(void*) (string).buffer";
            iVar1 = 0x9a8;
            goto LAB_0014ea49;
          }
          uStack_60 = 0x14def5;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9a8);
          pcVar8 = string.buffer;
          if (string.buffer != (char *)0x0) {
            uStack_60 = 0x14df15;
            iVar1 = strcmp("abcd01234567wxyz",string.buffer);
            if (iVar1 != 0) {
              pcVar7 = "\"";
              goto LAB_0014e5ee;
            }
            uStack_60 = 0x14df2e;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9a8);
            if (string.size != 0x10) {
              pcStack_70 = "strlen(\"abcd01234567wxyz\")";
              pcVar5 = "(string).size == strlen(\"abcd01234567wxyz\")";
              pcVar6 = "(string).size";
              pcVar7 = (char *)string.size;
              goto LAB_0014e65e;
            }
            uStack_60 = 0x14df4e;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9a8);
            uStack_60 = 0x14df56;
            AString_destruct(pAVar2);
            uStack_60 = 0x14df6a;
            pAVar2 = AString_substring(&string,8,0xffffffffffffffff);
            if (pAVar2 == (AString *)0x0) {
              pcVar7 = "(void*) substring != NULL";
              pcVar6 = "(void*) substring";
              iVar1 = 0x9ab;
              goto LAB_0014ea49;
            }
            uStack_60 = 0x14df87;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9ab);
            pcVar7 = (char *)pAVar2->capacity;
            if (pcVar7 != (char *)0x8) {
              pcStack_70 = "(8)";
              pcVar5 = "(*substring).capacity == (8)";
              pcVar6 = "(*substring).capacity";
LAB_0014e799:
              iVar1 = 0x9ac;
LAB_0014e906:
              local_68 = (char *)0x8;
              goto LAB_0014eae3;
            }
            uStack_60 = 0x14dfa6;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9ac);
            if (pAVar2->buffer == (char *)0x0) {
              pcVar7 = "(void*) (*substring).buffer != NULL";
              pcVar6 = "(void*) (*substring).buffer";
              iVar1 = 0x9ac;
              goto LAB_0014ea49;
            }
            uStack_60 = 0x14dfc2;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9ac);
            pcVar8 = pAVar2->buffer;
            if (pcVar8 == (char *)0x0) {
              pcVar7 = "";
              pcVar8 = "(null)";
LAB_0014e71e:
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar5 = "(*substring).buffer == (\"4567wxyz\")";
              pcVar6 = "(*substring).buffer";
              iVar1 = 0x9ac;
              local_68 = "\"";
              pcStack_70 = "4567wxyz";
              pcStack_78 = "\"";
              pcStack_80 = "(\"4567wxyz\")";
              ppcVar4 = &pcStack_90;
              pcStack_90 = pcVar8;
              pcStack_88 = pcVar7;
              goto LAB_0014eae5;
            }
            uStack_60 = 0x14dfde;
            iVar1 = strcmp("4567wxyz",pcVar8);
            if (iVar1 != 0) {
              pcVar7 = "\"";
              goto LAB_0014e71e;
            }
            uStack_60 = 0x14dff7;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9ac);
            pcVar7 = (char *)pAVar2->size;
            if (pcVar7 != (char *)0x8) {
              pcStack_70 = "strlen(\"4567wxyz\")";
              pcVar5 = "(*substring).size == strlen(\"4567wxyz\")";
              pcVar6 = "(*substring).size";
              goto LAB_0014e799;
            }
            uStack_60 = 0x14e016;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9ac);
            if (string.capacity != 0x10) {
              pcStack_70 = "(16)";
              pcVar5 = "(string).capacity == (16)";
              pcVar6 = "(string).capacity";
              pcVar7 = (char *)string.capacity;
LAB_0014e895:
              iVar1 = 0x9ad;
              goto LAB_0014eadd;
            }
            uStack_60 = 0x14e036;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9ad);
            if (string.buffer == (char *)0x0) {
              pcVar7 = "(void*) (string).buffer != NULL";
              pcVar6 = "(void*) (string).buffer";
              iVar1 = 0x9ad;
              goto LAB_0014ea49;
            }
            uStack_60 = 0x14e053;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9ad);
            pcVar8 = string.buffer;
            if (string.buffer == (char *)0x0) {
              pcVar8 = "(null)";
              pcVar7 = "";
            }
            else {
              uStack_60 = 0x14e073;
              iVar1 = strcmp("abcd01234567wxyz",string.buffer);
              if (iVar1 == 0) {
                uStack_60 = 0x14e08c;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x9ad);
                if (string.size != 0x10) {
                  pcStack_70 = "strlen(\"abcd01234567wxyz\")";
                  pcVar5 = "(string).size == strlen(\"abcd01234567wxyz\")";
                  pcVar6 = "(string).size";
                  pcVar7 = (char *)string.size;
                  goto LAB_0014e895;
                }
                uStack_60 = 0x14e0ac;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x9ad);
                uStack_60 = 0x14e0b4;
                AString_destruct(pAVar2);
                uStack_60 = 0x14e0c6;
                pAVar2 = AString_substring(&string,0xf,0x29a);
                if (pAVar2 == (AString *)0x0) {
                  pcVar7 = "(void*) substring != NULL";
                  pcVar6 = "(void*) substring";
                  iVar1 = 0x9b0;
                  goto LAB_0014ea49;
                }
                uStack_60 = 0x14e0e3;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x9b0);
                pcVar7 = (char *)pAVar2->capacity;
                if (pcVar7 != (char *)0x8) {
                  pcStack_70 = "(8)";
                  pcVar5 = "(*substring).capacity == (8)";
                  pcVar6 = "(*substring).capacity";
                  iVar1 = 0x9b1;
                  goto LAB_0014e906;
                }
                uStack_60 = 0x14e102;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x9b1);
                if (pAVar2->buffer == (char *)0x0) {
                  pcVar7 = "(void*) (*substring).buffer != NULL";
                  pcVar6 = "(void*) (*substring).buffer";
                  iVar1 = 0x9b1;
                  goto LAB_0014ea49;
                }
                uStack_60 = 0x14e11e;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x9b1);
                pcVar8 = pAVar2->buffer;
                if (pcVar8 == (char *)0x0) {
                  pcVar8 = "(null)";
                  pcVar7 = "";
LAB_0014e960:
                  pcVar5 = "(*substring).buffer == (\"z\")";
                  pcVar6 = "(void*) (*substring).buffer";
                  iVar1 = 0x9b1;
                  pcStack_70 = "z";
                  pcStack_80 = "(\"z\")";
                }
                else {
                  uStack_60 = 0x14e13a;
                  iVar1 = strcmp("z",pcVar8);
                  if (iVar1 != 0) {
                    pcVar7 = "\"";
                    goto LAB_0014e960;
                  }
                  uStack_60 = 0x14e153;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9b1);
                  pcVar7 = (char *)pAVar2->size;
                  if (pcVar7 != (char *)0x1) {
                    pcStack_70 = "strlen(\"z\")";
                    pcVar5 = "(*substring).size == strlen(\"z\")";
                    pcVar6 = "(*substring).size";
                    iVar1 = 0x9b1;
                    local_68 = (char *)0x1;
                    goto LAB_0014eae3;
                  }
                  uStack_60 = 0x14e172;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9b1);
                  if (string.capacity != 0x10) {
                    pcStack_70 = "(16)";
                    pcVar5 = "(string).capacity == (16)";
                    pcVar6 = "(string).capacity";
                    pcVar7 = (char *)string.capacity;
LAB_0014ead8:
                    iVar1 = 0x9b2;
                    goto LAB_0014eadd;
                  }
                  uStack_60 = 0x14e192;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9b2);
                  if (string.buffer == (char *)0x0) {
                    pcVar7 = "(void*) (string).buffer != NULL";
                    pcVar6 = "(void*) (string).buffer";
                    iVar1 = 0x9b2;
                    goto LAB_0014ea49;
                  }
                  uStack_60 = 0x14e1af;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9b2);
                  pcVar8 = string.buffer;
                  if (string.buffer == (char *)0x0) {
                    pcVar8 = "(null)";
                    pcVar7 = "";
                  }
                  else {
                    uStack_60 = 0x14e1cc;
                    iVar1 = strcmp("abcd01234567wxyz",string.buffer);
                    if (iVar1 == 0) {
                      uStack_60 = 0x14e1e5;
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x9b2);
                      if (string.size == 0x10) {
                        uStack_60 = 0x14e205;
                        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0x9b2);
                        uStack_60 = 0x14e20d;
                        AString_destruct(pAVar2);
                        uStack_60 = 0x14e216;
                        (*string.deallocator)(string.buffer);
                        return;
                      }
                      pcStack_70 = "strlen(\"abcd01234567wxyz\")";
                      pcVar5 = "(string).size == strlen(\"abcd01234567wxyz\")";
                      pcVar6 = "(string).size";
                      pcVar7 = (char *)string.size;
                      goto LAB_0014ead8;
                    }
                    pcVar7 = "\"";
                  }
                  pcVar5 = "(string).buffer == (\"abcd01234567wxyz\")";
                  pcVar6 = "(void*) (string).buffer";
                  iVar1 = 0x9b2;
                  pcStack_70 = "abcd01234567wxyz";
                  pcStack_80 = "(\"abcd01234567wxyz\")";
                }
                pcVar6 = pcVar6 + 8;
                local_68 = "\"";
                pcStack_78 = "\"";
                expr = 
                "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                ;
                pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                ppcVar4 = &pcStack_90;
                pcStack_90 = pcVar8;
                pcStack_88 = pcVar7;
                goto LAB_0014eae5;
              }
              pcVar7 = "\"";
            }
            pcVar5 = "(string).buffer == (\"abcd01234567wxyz\")";
            pcVar6 = "(string).buffer";
            iVar1 = 0x9ad;
            goto LAB_0014e862;
          }
          pcVar7 = "";
          pcVar8 = "(null)";
LAB_0014e5ee:
          iVar1 = 0x9a8;
          goto LAB_0014e624;
        }
        pcVar7 = "";
        pcVar8 = "(null)";
LAB_0014e501:
        pcVar5 = "(*substring).buffer == (\"abcd01234567wxyz\")";
        pcVar6 = "(*substring).buffer";
        iVar1 = 0x9a7;
      }
LAB_0014e862:
      local_68 = "\"";
      pcStack_70 = "abcd01234567wxyz";
      pcStack_78 = "\"";
      pcStack_80 = "(\"abcd01234567wxyz\")";
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      ppcVar4 = &pcStack_90;
      pcStack_90 = pcVar8;
      pcStack_88 = pcVar7;
      goto LAB_0014eae5;
    }
    pcVar7 = "\"";
  }
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  pcVar5 = "(*substring).buffer == (\"abcd01234567wxyz\")";
  pcVar6 = "(*substring).buffer";
  iVar1 = 0x9a2;
  local_68 = "\"";
  pcStack_70 = "abcd01234567wxyz";
  pcStack_78 = "\"";
  pcStack_80 = "(\"abcd01234567wxyz\")";
  ppcVar4 = &pcStack_90;
  pcStack_90 = pcVar8;
  pcStack_88 = pcVar7;
LAB_0014eae5:
  uStack_60 = 0;
  *(char **)((long)ppcVar4 + -8) = pcVar7;
  *(code **)((long)ppcVar4 + -0x10) = test_AString_substring_indexBeyondBounds_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar5,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_AString_substring_rangeBeyondBounds)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("abcd01234567wxyz", 16);
    struct AString *substring;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    substring = AString_substring(&string, 0, 17);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "abcd01234567wxyz", 16);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "abcd01234567wxyz", 16);
    AString_destruct(substring);
    substring = AString_substring(&string, 0, -1);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "abcd01234567wxyz", 16);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "abcd01234567wxyz", 16);
    AString_destruct(substring);
    substring = AString_substring(&string, 8, -1);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "4567wxyz", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "abcd01234567wxyz", 16);
    AString_destruct(substring);
    substring = AString_substring(&string, 15, 666);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "z", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "abcd01234567wxyz", 16);
    AString_destruct(substring);
    private_ACUtilsTest_AString_destructTestString(string);
}